

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_location_handler.c
# Opt level: O3

void cio_http_location_handler_init(cio_http_location_handler *handler)

{
  handler->on_body = (cio_http_data_cb_t)0x0;
  handler->on_message_complete = (cio_http_cb_t)0x0;
  handler->on_header_field_value = (cio_http_data_cb_t)0x0;
  handler->on_headers_complete = (cio_http_cb_t)0x0;
  handler->on_fragment = (cio_http_data_cb_t)0x0;
  handler->on_header_field_name = (cio_http_data_cb_t)0x0;
  handler->on_path = (cio_http_data_cb_t)0x0;
  handler->on_query = (cio_http_data_cb_t)0x0;
  handler->on_host = (cio_http_data_cb_t)0x0;
  handler->on_port = (cio_http_data_cb_t)0x0;
  handler->on_url = (cio_http_data_cb_t)0x0;
  handler->on_schema = (cio_http_data_cb_t)0x0;
  handler->free = (_func_void_cio_http_location_handler_ptr *)0x0;
  return;
}

Assistant:

void cio_http_location_handler_init(struct cio_http_location_handler *handler)
{
	handler->on_url = NULL;
	handler->on_port = NULL;
	handler->on_schema = NULL;
	handler->on_host = NULL;
	handler->on_path = NULL;
	handler->on_query = NULL;
	handler->on_fragment = NULL;
	handler->on_header_field_name = NULL;
	handler->on_header_field_value = NULL;
	handler->on_headers_complete = NULL;
	handler->on_body = NULL;
	handler->on_message_complete = NULL;
	handler->free = NULL;
}